

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

bool __thiscall
google::protobuf::FileDescriptorTables::AddAliasUnderParent
          (FileDescriptorTables *this,void *parent,string *name,Symbol symbol)

{
  __node_base *p_Var1;
  size_type *psVar2;
  _Hash_node_base *p_Var3;
  size_t __c;
  __node_ptr p_Var4;
  __node_ptr p_Var5;
  __buckets_ptr pp_Var6;
  __node_base_ptr p_Var7;
  ulong uVar8;
  size_type __bkt_count;
  ulong uVar9;
  _Hash_node_base *p_Var10;
  undefined1 auVar11 [16];
  _Scoped_node local_60;
  pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol> local_50;
  
  local_50.second.field_1 = symbol.field_1;
  local_50.first.second = (name->_M_dataplus)._M_p;
  local_50.second.type = symbol.type;
  local_50.first.first = parent;
  __c = anon_unknown_1::PointerStringPairHash::operator()
                  ((PointerStringPairHash *)&local_50,(PointerStringPair *)parent);
  uVar8 = __c % (this->symbols_by_parent_)._M_h._M_bucket_count;
  p_Var4 = std::
           _Hashtable<std::pair<const_void_*,_const_char_*>,_std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol>_>,_std::__detail::_Select1st,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_node((_Hashtable<std::pair<const_void_*,_const_char_*>,_std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol>_>,_std::__detail::_Select1st,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                           *)this,uVar8,&local_50.first,__c);
  if (p_Var4 == (__node_ptr)0x0) {
    p_Var5 = std::__detail::
             _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<std::pair<void_const*,char_const*>const,google::protobuf::Symbol>,true>>>
             ::
             _M_allocate_node<std::pair<std::pair<void_const*,char_const*>const,google::protobuf::Symbol>const&>
                       ((_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<std::pair<void_const*,char_const*>const,google::protobuf::Symbol>,true>>>
                         *)this,&local_50);
    local_60._M_h = (__hashtable_alloc *)this;
    local_60._M_node = p_Var5;
    auVar11 = std::__detail::_Prime_rehash_policy::_M_need_rehash
                        ((ulong)&(this->symbols_by_parent_)._M_h._M_rehash_policy,
                         (this->symbols_by_parent_)._M_h._M_bucket_count,
                         (this->symbols_by_parent_)._M_h._M_element_count);
    __bkt_count = auVar11._8_8_;
    if ((auVar11 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      pp_Var6 = (this->symbols_by_parent_)._M_h._M_buckets;
    }
    else {
      pp_Var6 = std::
                _Hashtable<std::pair<const_void_*,_const_char_*>,_std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol>_>,_std::__detail::_Select1st,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::_M_allocate_buckets
                          ((_Hashtable<std::pair<const_void_*,_const_char_*>,_std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol>_>,_std::__detail::_Select1st,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                            *)this,__bkt_count);
      p_Var1 = &(this->symbols_by_parent_)._M_h._M_before_begin;
      p_Var3 = (this->symbols_by_parent_)._M_h._M_before_begin._M_nxt;
      (this->symbols_by_parent_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      uVar8 = 0;
LAB_0028ba7e:
      p_Var10 = p_Var3;
      uVar9 = uVar8;
      if (p_Var10 != (_Hash_node_base *)0x0) {
        p_Var3 = p_Var10->_M_nxt;
        uVar8 = (ulong)p_Var10[5]._M_nxt % __bkt_count;
        if (pp_Var6[uVar8] == (__node_base_ptr)0x0) goto LAB_0028baaf;
        p_Var10->_M_nxt = pp_Var6[uVar8]->_M_nxt;
        p_Var7 = pp_Var6[uVar8];
        uVar8 = uVar9;
        goto LAB_0028bace;
      }
      std::
      _Hashtable<std::pair<const_void_*,_const_char_*>,_std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol>_>,_std::__detail::_Select1st,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::_M_deallocate_buckets
                ((_Hashtable<std::pair<const_void_*,_const_char_*>,_std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol>_>,_std::__detail::_Select1st,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)this);
      (this->symbols_by_parent_)._M_h._M_bucket_count = __bkt_count;
      (this->symbols_by_parent_)._M_h._M_buckets = pp_Var6;
      uVar8 = __c % __bkt_count;
    }
    (p_Var5->
    super__Hash_node_value<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol>,_true>
    ).super__Hash_node_code_cache<true>._M_hash_code = __c;
    if (pp_Var6[uVar8] == (__node_base_ptr)0x0) {
      (p_Var5->super__Hash_node_base)._M_nxt =
           (this->symbols_by_parent_)._M_h._M_before_begin._M_nxt;
      (this->symbols_by_parent_)._M_h._M_before_begin._M_nxt = &p_Var5->super__Hash_node_base;
      p_Var3 = (p_Var5->super__Hash_node_base)._M_nxt;
      if (p_Var3 != (_Hash_node_base *)0x0) {
        pp_Var6[(ulong)p_Var3[5]._M_nxt % (this->symbols_by_parent_)._M_h._M_bucket_count] =
             &p_Var5->super__Hash_node_base;
        pp_Var6 = (this->symbols_by_parent_)._M_h._M_buckets;
      }
      pp_Var6[uVar8] = &(this->symbols_by_parent_)._M_h._M_before_begin;
    }
    else {
      (p_Var5->super__Hash_node_base)._M_nxt = pp_Var6[uVar8]->_M_nxt;
      pp_Var6[uVar8]->_M_nxt = &p_Var5->super__Hash_node_base;
    }
    psVar2 = &(this->symbols_by_parent_)._M_h._M_element_count;
    *psVar2 = *psVar2 + 1;
    local_60._M_node = (__node_ptr)0x0;
    std::
    _Hashtable<std::pair<const_void_*,_const_char_*>,_std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol>_>,_std::__detail::_Select1st,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_Scoped_node::~_Scoped_node(&local_60);
  }
  return p_Var4 == (__node_ptr)0x0;
LAB_0028baaf:
  p_Var10->_M_nxt = p_Var1->_M_nxt;
  p_Var1->_M_nxt = p_Var10;
  pp_Var6[uVar8] = p_Var1;
  if (p_Var10->_M_nxt != (_Hash_node_base *)0x0) {
    p_Var7 = (__node_base_ptr)(pp_Var6 + uVar9);
LAB_0028bace:
    p_Var7->_M_nxt = p_Var10;
  }
  goto LAB_0028ba7e;
}

Assistant:

bool FileDescriptorTables::AddAliasUnderParent(const void* parent,
                                               const std::string& name,
                                               Symbol symbol) {
  PointerStringPair by_parent_key(parent, name.c_str());
  return InsertIfNotPresent(&symbols_by_parent_, by_parent_key, symbol);
}